

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

ptls_openssl_signature_scheme_t * ptls_openssl_lookup_signature_schemes(EVP_PKEY *key)

{
  int iVar1;
  ec_key_st *key_00;
  EC_GROUP *group;
  EC_KEY *eckey;
  ptls_openssl_signature_scheme_t *schemes;
  EVP_PKEY *key_local;
  
  eckey = (EC_KEY *)0x0;
  iVar1 = EVP_PKEY_get_id(key);
  if (iVar1 == 6) {
    eckey = (EC_KEY *)rsa_signature_schemes;
  }
  else if (iVar1 == 0x198) {
    key_00 = EVP_PKEY_get1_EC_KEY((EVP_PKEY *)key);
    group = EC_KEY_get0_group(key_00);
    iVar1 = EC_GROUP_get_curve_name(group);
    if (iVar1 == 0x19f) {
      eckey = (EC_KEY *)secp256r1_signature_schemes;
    }
    else if (iVar1 == 0x2cb) {
      eckey = (EC_KEY *)secp384r1_signature_schemes;
    }
    else if (iVar1 == 0x2cc) {
      eckey = (EC_KEY *)secp521r1_signature_schemes;
    }
    EC_KEY_free(key_00);
  }
  else if (iVar1 == 0x43f) {
    eckey = (EC_KEY *)ed25519_signature_schemes;
  }
  return (ptls_openssl_signature_scheme_t *)eckey;
}

Assistant:

const ptls_openssl_signature_scheme_t *ptls_openssl_lookup_signature_schemes(EVP_PKEY *key)
{
    const ptls_openssl_signature_scheme_t *schemes = NULL;

    switch (EVP_PKEY_id(key)) {
    case EVP_PKEY_RSA:
        schemes = rsa_signature_schemes;
        break;
    case EVP_PKEY_EC: {
        EC_KEY *eckey = EVP_PKEY_get1_EC_KEY(key);
        switch (EC_GROUP_get_curve_name(EC_KEY_get0_group(eckey))) {
        case NID_X9_62_prime256v1:
            schemes = secp256r1_signature_schemes;
            break;
#if PTLS_OPENSSL_HAVE_SECP384R1
        case NID_secp384r1:
            schemes = secp384r1_signature_schemes;
            break;
#endif
#if PTLS_OPENSSL_HAVE_SECP521R1
        case NID_secp521r1:
            schemes = secp521r1_signature_schemes;
            break;
#endif
        default:
            break;
        }
        EC_KEY_free(eckey);
    } break;
#if PTLS_OPENSSL_HAVE_ED25519
    case EVP_PKEY_ED25519:
        schemes = ed25519_signature_schemes;
        break;
#endif
    default:
        break;
    }

    return schemes;
}